

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map.h
# Opt level: O0

const_iterator
frozen::
unordered_map<unsigned_int,unsigned_int,2ul,frozen::elsa<unsigned_int>,std::equal_to<unsigned_int>>
::
find_impl<frozen::unordered_map<unsigned_int,unsigned_int,2ul,frozen::elsa<unsigned_int>,std::equal_to<unsigned_int>>const&,int,frozen::elsa<unsigned_int>,std::equal_to<unsigned_int>>
          (unordered_map<unsigned_int,_unsigned_int,_2UL,_frozen::elsa<unsigned_int>,_std::equal_to<unsigned_int>_>
           *self,int *key,elsa<unsigned_int> *hash,equal_to<unsigned_int> *equal)

{
  const_iterator pvVar1;
  unordered_map<unsigned_int,_unsigned_int,_2UL,_frozen::elsa<unsigned_int>,_std::equal_to<unsigned_int>_>
  *puVar2;
  unordered_map<unsigned_int,_unsigned_int,_2UL,_frozen::elsa<unsigned_int>,_std::equal_to<unsigned_int>_>
  *puVar3;
  bool local_45;
  uint local_44;
  unordered_map<unsigned_int,_unsigned_int,_2UL,_frozen::elsa<unsigned_int>,_std::equal_to<unsigned_int>_>
  *local_40;
  const_iterator it;
  size_t pos;
  equal_to<unsigned_int> *equal_local;
  elsa<unsigned_int> *hash_local;
  int *key_local;
  unordered_map<unsigned_int,_unsigned_int,_2UL,_frozen::elsa<unsigned_int>,_std::equal_to<unsigned_int>_>
  *self_local;
  
  pos = (size_t)equal;
  equal_local = (equal_to<unsigned_int> *)hash;
  hash_local = (elsa<unsigned_int> *)key;
  key_local = (int *)self;
  it = (const_iterator)
       bits::pmh_tables<4ul,frozen::elsa<unsigned_int>>::lookup<int,frozen::elsa<unsigned_int>>
                 ((pmh_tables<4ul,frozen::elsa<unsigned_int>> *)&self->tables_,key,hash);
  pvVar1 = bits::carray<std::pair<const_unsigned_int,_unsigned_int>,_2UL>::begin
                     ((carray<std::pair<const_unsigned_int,_unsigned_int>,_2UL> *)key_local);
  puVar2 = (unordered_map<unsigned_int,_unsigned_int,_2UL,_frozen::elsa<unsigned_int>,_std::equal_to<unsigned_int>_>
            *)(pvVar1 + (long)it);
  local_40 = puVar2;
  puVar3 = (unordered_map<unsigned_int,_unsigned_int,_2UL,_frozen::elsa<unsigned_int>,_std::equal_to<unsigned_int>_>
            *)bits::carray<std::pair<const_unsigned_int,_unsigned_int>,_2UL>::end
                        ((carray<std::pair<const_unsigned_int,_unsigned_int>,_2UL> *)key_local);
  local_45 = false;
  if (puVar2 != puVar3) {
    local_44 = *(uint *)hash_local;
    local_45 = std::equal_to<unsigned_int>::operator()
                         ((equal_to<unsigned_int> *)pos,(uint *)local_40,&local_44);
  }
  if (local_45 == false) {
    self_local = (unordered_map<unsigned_int,_unsigned_int,_2UL,_frozen::elsa<unsigned_int>,_std::equal_to<unsigned_int>_>
                  *)bits::carray<std::pair<const_unsigned_int,_unsigned_int>,_2UL>::end
                              ((carray<std::pair<const_unsigned_int,_unsigned_int>,_2UL> *)key_local
                              );
  }
  else {
    self_local = local_40;
  }
  return (const_iterator)self_local;
}

Assistant:

static inline constexpr auto find_impl(This&& self, KeyType const &key, Hasher const &hash, Equal const &equal) {
    auto const pos = self.tables_.lookup(key, hash);
    auto it = self.items_.begin() + pos;
    if (it != self.items_.end() && equal(it->first, key))
      return it;
    else
      return self.items_.end();
  }